

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O2

void __thiscall spvtools::opt::RegisterLiveness::Analyze(RegisterLiveness *this,Function *f)

{
  pointer puVar1;
  BasicBlock *pBVar2;
  pointer ppLVar3;
  Instruction *pIVar4;
  Instruction *this_00;
  RegisterLiveness *pRVar5;
  bool bVar6;
  uint32_t uVar7;
  RegionRegisterLiveness *pRVar8;
  size_t sVar9;
  pointer ppLVar10;
  __node_base *p_Var11;
  pointer puVar12;
  Instruction *pIVar13;
  size_t reg_count;
  pointer local_d0;
  pointer local_c8;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  die_in_block;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  ComputeRegisterLiveness local_68;
  
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->block_pressure_)._M_h);
  local_68.context_ = this->context_;
  local_68.reg_pressure_ = this;
  local_68.function_ = f;
  local_68.cfg_ = IRContext::cfg(local_68.context_);
  local_68.def_use_manager_ = IRContext::get_def_use_mgr(this->context_);
  local_68.dom_tree_ = (DominatorTree *)IRContext::GetDominatorAnalysis(this->context_,f);
  local_68.loop_desc_ = IRContext::GetLoopDescriptor(this->context_,f);
  puVar1 = (f->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar12 = (f->blocks_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pRVar5 = local_68.reg_pressure_,
      puVar12 != puVar1; puVar12 = puVar12 + 1) {
    pBVar2 = (puVar12->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    uVar7 = BasicBlock::id(pBVar2);
    pRVar8 = Get(pRVar5,uVar7);
    if (pRVar8 == (RegionRegisterLiveness *)0x0) {
      die_in_block._M_h._M_bucket_count = 0;
      die_in_block._M_h._M_element_count =
           (size_type)
           std::
           _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:84:47)>
           ::_M_invoke;
      die_in_block._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)
           std::
           _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:84:47)>
           ::_M_manager;
      die_in_block._M_h._M_buckets = (__buckets_ptr)&local_68;
      CFG::ForEachBlockInPostOrder
                (local_68.cfg_,pBVar2,(function<void_(spvtools::opt::BasicBlock_*)> *)&die_in_block)
      ;
      if (die_in_block._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        (*(code *)die_in_block._M_h._M_before_begin._M_nxt)
                  ((function<void_(spvtools::opt::BasicBlock_*)> *)&die_in_block,
                   (function<void_(spvtools::opt::BasicBlock_*)> *)&die_in_block,3);
      }
    }
  }
  ppLVar3 = ((local_68.loop_desc_)->placeholder_top_loop_).nested_loops_.
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar10 = ((local_68.loop_desc_)->placeholder_top_loop_).nested_loops_.
                  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppLVar10 != ppLVar3;
      ppLVar10 = ppLVar10 + 1) {
    anon_unknown_8::ComputeRegisterLiveness::DoLoopLivenessUnification(&local_68,*ppLVar10);
  }
  puVar12 = ((local_68.function_)->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_d0 = ((local_68.function_)->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    pRVar5 = local_68.reg_pressure_;
    if (puVar12 == local_d0) {
      return;
    }
    pBVar2 = (puVar12->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    uVar7 = BasicBlock::id(pBVar2);
    pRVar8 = Get(pRVar5,uVar7);
    if (pRVar8 == (RegionRegisterLiveness *)0x0) break;
    reg_count = (pRVar8->live_out_)._M_h._M_element_count;
    p_Var11 = &(pRVar8->live_out_)._M_h._M_before_begin;
    while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
      RegionRegisterLiveness::AddRegisterClass(pRVar8,(Instruction *)p_Var11[1]._M_nxt);
    }
    pRVar8->used_registers_ = reg_count;
    die_in_block._M_h._M_buckets = &die_in_block._M_h._M_single_bucket;
    die_in_block._M_h._M_bucket_count = 1;
    die_in_block._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    die_in_block._M_h._M_element_count = 0;
    die_in_block._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    die_in_block._M_h._M_rehash_policy._M_next_resize = 0;
    die_in_block._M_h._M_single_bucket = (__node_base_ptr)0x0;
    pIVar4 = *(Instruction **)
              ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    pIVar13 = (Instruction *)
              ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
    local_c8 = puVar12;
    while ((pIVar13 != pIVar4 &&
           (this_00 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_,
           this_00->opcode_ != OpPhi))) {
      local_88._8_8_ = 0;
      local_88._M_unused._M_object = ::operator_new(0x20);
      *(RegionRegisterLiveness **)local_88._M_unused._0_8_ = pRVar8;
      *(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        **)((long)local_88._M_unused._0_8_ + 8) = &die_in_block;
      *(size_t **)((long)local_88._M_unused._0_8_ + 0x10) = &reg_count;
      *(ComputeRegisterLiveness **)((long)local_88._M_unused._0_8_ + 0x18) = &local_68;
      local_70 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:231:13)>
                 ::_M_invoke;
      local_78 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:231:13)>
                 ::_M_manager;
      Instruction::ForEachInId(this_00,(function<void_(unsigned_int_*)> *)&local_88);
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,__destroy_functor);
      }
      sVar9 = reg_count;
      if (reg_count < pRVar8->used_registers_) {
        sVar9 = pRVar8->used_registers_;
      }
      pRVar8->used_registers_ = sVar9;
      bVar6 = anon_unknown_8::CreatesRegisterUsage(this_00);
      if (bVar6) {
        reg_count = reg_count - 1;
      }
      pIVar13 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&die_in_block._M_h);
    puVar12 = local_c8 + 1;
  }
  __assert_fail("live_inout != nullptr && \"Basic block not processed\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                ,0xd6,
                "void spvtools::opt::(anonymous namespace)::ComputeRegisterLiveness::EvaluateRegisterRequirements()"
               );
}

Assistant:

void RegisterLiveness::Analyze(Function* f) {
  block_pressure_.clear();
  ComputeRegisterLiveness(this, f).Compute();
}